

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t roaring_bitmap_range_cardinality
                   (roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  ushort uVar2;
  int32_t iVar3;
  int iVar4;
  ulong in_RDX;
  ulong in_RSI;
  int *in_RDI;
  uint16_t key;
  int i;
  uint64_t card;
  uint16_t maxhb;
  uint16_t minhb;
  roaring_array_t *ra;
  roaring_array_t *in_stack_ffffffffffffffb8;
  int local_3c;
  uint64_t local_38;
  ulong local_20;
  uint64_t local_8;
  
  local_20 = in_RDX;
  if (0xffffffff < in_RDX) {
    local_20 = 0x100000000;
  }
  if (in_RSI < local_20) {
    uVar2 = (ushort)(local_20 - 1 >> 0x10);
    local_38 = 0;
    iVar3 = ra_get_index(in_stack_ffffffffffffffb8,0);
    if (iVar3 < 0) {
      local_3c = -1 - iVar3;
    }
    else {
      if ((ushort)(in_RSI >> 0x10) == uVar2) {
        iVar4 = container_rank(in_stack_ffffffffffffffb8,'\0',0);
      }
      else {
        iVar4 = container_get_cardinality(in_stack_ffffffffffffffb8,'\0');
      }
      local_38 = (uint64_t)iVar4;
      if ((in_RSI & 0xffff) != 0) {
        iVar4 = container_rank(in_stack_ffffffffffffffb8,'\0',0);
        local_38 = local_38 - (long)iVar4;
      }
      local_3c = iVar3 + 1;
    }
    for (; local_3c < *in_RDI; local_3c = local_3c + 1) {
      uVar1 = *(ushort *)(*(long *)(in_RDI + 4) + (long)local_3c * 2);
      if (uVar2 <= uVar1) {
        if (uVar1 == uVar2) {
          iVar4 = container_rank(in_stack_ffffffffffffffb8,'\0',0);
          local_38 = (long)iVar4 + local_38;
        }
        break;
      }
      iVar4 = container_get_cardinality(in_stack_ffffffffffffffb8,'\0');
      local_38 = (long)iVar4 + local_38;
    }
    local_8 = local_38;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t roaring_bitmap_range_cardinality(const roaring_bitmap_t *r,
                                          uint64_t range_start,
                                          uint64_t range_end) {
    const roaring_array_t *ra = &r->high_low_container;

    if (range_end > UINT32_MAX) {
        range_end = UINT32_MAX + UINT64_C(1);
    }
    if (range_start >= range_end) {
        return 0;
    }
    range_end--;  // make range_end inclusive
    // now we have: 0 <= range_start <= range_end <= UINT32_MAX

    uint16_t minhb = (uint16_t)(range_start >> 16);
    uint16_t maxhb = (uint16_t)(range_end >> 16);

    uint64_t card = 0;

    int i = ra_get_index(ra, minhb);
    if (i >= 0) {
        if (minhb == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
        } else {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        }
        if ((range_start & 0xffff) != 0) {
            card -= container_rank(ra->containers[i], ra->typecodes[i],
                                   (range_start & 0xffff) - 1);
        }
        i++;
    } else {
        i = -i - 1;
    }

    for (; i < ra->size; i++) {
        uint16_t key = ra->keys[i];
        if (key < maxhb) {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        } else if (key == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
            break;
        } else {
            break;
        }
    }

    return card;
}